

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  ParamIterator<int> *in_RDI;
  bool dummy [2];
  bool at_end;
  undefined1 local_21;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 uVar2;
  undefined1 uVar3;
  
  uVar2 = 0;
  uVar1 = 1;
  std::
  get<0ul,testing::internal::ParamIterator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
              *)0xaf75b3);
  std::
  get<0ul,testing::internal::ParamIterator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
              *)0xaf75c6);
  uVar1 = ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>::operator==
                    ((ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)> *)
                     CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffff6,
                                             CONCAT15(in_stack_fffffffffffffff5,
                                                      CONCAT14(uVar1,in_stack_fffffffffffffff0)))),
                     (ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)> *)in_RDI);
  local_21 = true;
  if (!(bool)uVar1) {
    uVar2 = uVar1;
    uVar3 = uVar1;
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
                *)0xaf7613);
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
                *)0xaf7625);
    local_21 = ParamIterator<int>::operator==
                         ((ParamIterator<int> *)
                          CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffff6,
                                                  CONCAT15(uVar2,CONCAT14(uVar1,
                                                  in_stack_fffffffffffffff0)))),in_RDI);
  }
  return local_21;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }